

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

int cmcmd_cmake_ninja_dyndep(const_iterator argBeg,const_iterator argEnd)

{
  size_type *psVar1;
  pointer *pppcVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  size_t len;
  Value *pVVar5;
  undefined8 *puVar6;
  cmGlobalNinjaGenerator *this;
  uint uVar7;
  string *this_00;
  undefined8 uVar8;
  pointer __rhs;
  const_iterator cVar9;
  string dir_cur_src;
  string dir_top_src;
  string dir_top_bld;
  string arg_tdi;
  undefined1 local_5d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c8;
  string arg_lang;
  string arg_dd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked_target_dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_ddis;
  string module_dir;
  Value tdio;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arg_full;
  string dir_cur_bld;
  deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_> local_488;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [3];
  _Alloc_hider local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  cmake cm;
  SelfType local_40;
  
  cmSystemTools::HandleResponseFile(&arg_full,argBeg,argEnd);
  arg_dd._M_dataplus._M_p = (pointer)&arg_dd.field_2;
  arg_dd._M_string_length = 0;
  arg_dd.field_2._M_local_buf[0] = '\0';
  arg_lang._M_dataplus._M_p = (pointer)&arg_lang.field_2;
  arg_lang._M_string_length = 0;
  arg_lang.field_2._M_local_buf[0] = '\0';
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arg_ddis.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (arg_full.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      arg_full.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0026aac5:
    pppcVar2 = &cm.Generators.
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cm.Generators.
    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pppcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&cm,"-E cmake_ninja_dyndep requires value for --tdi=","");
    cmSystemTools::Error((string *)&cm);
    if (cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)pppcVar2) {
LAB_0026ab06:
      operator_delete(cm.Generators.
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)cm.Generators.
                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  else {
    __rhs = arg_full.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      __s1 = (__rhs->_M_dataplus)._M_p;
      iVar4 = strncmp(__s1,"--tdi=",6);
      if (iVar4 == 0) {
        std::__cxx11::string::substr((ulong)&cm,(ulong)__rhs);
        this_00 = &arg_tdi;
LAB_0026a7d9:
        std::__cxx11::string::operator=((string *)this_00,(string *)&cm);
        if (cm.Generators.
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&cm.Generators.
                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(cm.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)cm.Generators.
                                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
      }
      else {
        iVar4 = strncmp(__s1,"--lang=",7);
        if (iVar4 == 0) {
          std::__cxx11::string::substr((ulong)&cm,(ulong)__rhs);
          this_00 = &arg_lang;
          goto LAB_0026a7d9;
        }
        iVar4 = strncmp(__s1,"--dd=",5);
        if (iVar4 == 0) {
          std::__cxx11::string::substr((ulong)&cm,(ulong)__rhs);
          this_00 = &arg_dd;
          goto LAB_0026a7d9;
        }
        if ((((*__s1 == '-') && (__s1[1] == '-')) || (__rhs->_M_string_length < 4)) ||
           (iVar4 = strcmp(__s1 + (__rhs->_M_string_length - 4),".ddi"), iVar4 != 0)) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm,
                         "-E cmake_ninja_dyndep unknown argument: ",__rhs);
          cmSystemTools::Error((string *)&cm);
          goto LAB_0026ac3d;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&arg_ddis,__rhs);
      }
      __rhs = __rhs + 1;
    } while (__rhs != arg_full.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
    if (arg_tdi._M_string_length == 0) goto LAB_0026aac5;
    if (arg_lang._M_string_length == 0) {
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&cm.Generators.
                     super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cm,"-E cmake_ninja_dyndep requires value for --lang=","");
      cmSystemTools::Error((string *)&cm);
    }
    else {
      if (arg_dd._M_string_length != 0) {
        Json::Value::Value(&tdio,nullValue);
        std::ifstream::ifstream(&cm,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
        Json::Reader::Reader((Reader *)&dir_cur_bld);
        bVar3 = Json::Reader::parse((Reader *)&dir_cur_bld,(istream *)&cm,&tdio,false);
        if (bVar3) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_p != &local_3e0) {
            operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_p != local_428) {
            operator_delete(local_438._M_p,local_428[0]._M_allocated_capacity + 1);
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    (&local_488);
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&dir_cur_bld);
          std::ifstream::~ifstream(&cm);
          pVVar5 = Json::Value::operator[](&tdio,"dir-cur-bld");
          Json::Value::asString_abi_cxx11_(&dir_cur_bld,pVVar5);
          pVVar5 = Json::Value::operator[](&tdio,"dir-cur-src");
          Json::Value::asString_abi_cxx11_(&dir_cur_src,pVVar5);
          pVVar5 = Json::Value::operator[](&tdio,"dir-top-bld");
          Json::Value::asString_abi_cxx11_(&dir_top_bld,pVVar5);
          pVVar5 = Json::Value::operator[](&tdio,"dir-top-src");
          Json::Value::asString_abi_cxx11_(&dir_top_src,pVVar5);
          pVVar5 = Json::Value::operator[](&tdio,"module-dir");
          Json::Value::asString_abi_cxx11_(&module_dir,pVVar5);
          if ((module_dir._M_string_length != 0) &&
             ((module_dir._M_dataplus._M_p[module_dir._M_string_length - 1] != '/' ||
              (module_dir._M_dataplus._M_p[module_dir._M_string_length] != '\0')))) {
            std::__cxx11::string::append((char *)&module_dir);
          }
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          linked_target_dirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVVar5 = Json::Value::operator[](&tdio,"linked-target-dirs");
          bVar3 = Json::Value::isArray(pVVar5);
          if (bVar3) {
            cVar9 = Json::Value::begin(pVVar5);
            local_5d8._0_8_ = cVar9.super_ValueIteratorBase.current_._M_node;
            local_5d8[8] = cVar9.super_ValueIteratorBase.isNull_;
            cVar9 = Json::Value::end(pVVar5);
            local_40.current_ = cVar9.super_ValueIteratorBase.current_._M_node;
            local_40.isNull_ = cVar9.super_ValueIteratorBase.isNull_;
            while (bVar3 = Json::ValueIteratorBase::isEqual
                                     ((ValueIteratorBase *)local_5d8,&local_40), !bVar3) {
              pVVar5 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_5d8);
              Json::Value::asString_abi_cxx11_((string *)&cm,pVVar5);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &linked_target_dirs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cm);
              if (cm.Generators.
                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pointer)&cm.Generators.
                            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(cm.Generators.
                                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)cm.Generators.
                                      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
              }
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_5d8);
            }
          }
          cmake::cmake(&cm,RoleInternal,Unknown);
          cmake::SetHomeDirectory(&cm,&dir_top_src);
          cmake::SetHomeOutputDirectory(&cm,&dir_top_bld);
          local_5d8._0_8_ = &local_5c8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"Ninja","");
          this = (cmGlobalNinjaGenerator *)cmake::CreateGlobalGenerator(&cm,(string *)local_5d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5d8._0_8_ != &local_5c8) {
            operator_delete((void *)local_5d8._0_8_,local_5c8._M_allocated_capacity + 1);
          }
          if (this == (cmGlobalNinjaGenerator *)0x0) {
            uVar7 = 1;
          }
          else {
            bVar3 = cmGlobalNinjaGenerator::WriteDyndepFile
                              (this,&dir_top_src,&dir_top_bld,&dir_cur_src,&dir_cur_bld,&arg_dd,
                               &arg_ddis,&module_dir,&linked_target_dirs,&arg_lang);
            uVar7 = (uint)!bVar3;
            (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [1])(this);
          }
          cmake::~cmake(&cm);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&linked_target_dirs);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)module_dir._M_dataplus._M_p != &module_dir.field_2) {
            operator_delete(module_dir._M_dataplus._M_p,module_dir.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_src._M_dataplus._M_p != &dir_top_src.field_2) {
            operator_delete(dir_top_src._M_dataplus._M_p,
                            dir_top_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_bld._M_dataplus._M_p != &dir_top_bld.field_2) {
            operator_delete(dir_top_bld._M_dataplus._M_p,
                            dir_top_bld.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_src._M_dataplus._M_p != &dir_cur_src.field_2) {
            operator_delete(dir_cur_src._M_dataplus._M_p,
                            dir_cur_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_bld._M_dataplus._M_p != &dir_cur_bld.field_2) {
            operator_delete(dir_cur_bld._M_dataplus._M_p,
                            dir_cur_bld.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::operator+(&dir_top_bld,"-E cmake_ninja_dyndep failed to parse ",&arg_tdi);
          Json::Reader::getFormattedErrorMessages_abi_cxx11_(&dir_top_src,(Reader *)&dir_cur_bld);
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_bld._M_dataplus._M_p != &dir_top_bld.field_2) {
            uVar8 = dir_top_bld.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < dir_top_src._M_string_length + dir_top_bld._M_string_length) {
            uVar8 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dir_top_src._M_dataplus._M_p != &dir_top_src.field_2) {
              uVar8 = dir_top_src.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar8 < dir_top_src._M_string_length + dir_top_bld._M_string_length)
            goto LAB_0026accf;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&dir_top_src,0,(char *)0x0,
                                (ulong)dir_top_bld._M_dataplus._M_p);
          }
          else {
LAB_0026accf:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&dir_top_bld,(ulong)dir_top_src._M_dataplus._M_p);
          }
          dir_cur_src._M_dataplus._M_p = (pointer)&dir_cur_src.field_2;
          psVar1 = puVar6 + 2;
          if ((size_type *)*puVar6 == psVar1) {
            dir_cur_src.field_2._M_allocated_capacity = *psVar1;
            dir_cur_src.field_2._8_8_ = puVar6[3];
          }
          else {
            dir_cur_src.field_2._M_allocated_capacity = *psVar1;
            dir_cur_src._M_dataplus._M_p = (pointer)*puVar6;
          }
          dir_cur_src._M_string_length = puVar6[1];
          *puVar6 = psVar1;
          puVar6[1] = 0;
          *(char *)psVar1 = '\0';
          cmSystemTools::Error(&dir_cur_src);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_cur_src._M_dataplus._M_p != &dir_cur_src.field_2) {
            operator_delete(dir_cur_src._M_dataplus._M_p,
                            dir_cur_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_src._M_dataplus._M_p != &dir_top_src.field_2) {
            operator_delete(dir_top_src._M_dataplus._M_p,
                            dir_top_src.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dir_top_bld._M_dataplus._M_p != &dir_top_bld.field_2) {
            operator_delete(dir_top_bld._M_dataplus._M_p,
                            dir_top_bld.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f0._M_p != &local_3e0) {
            operator_delete(local_3f0._M_p,local_3e0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_p != local_428) {
            operator_delete(local_438._M_p,local_428[0]._M_allocated_capacity + 1);
          }
          std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
                    (&local_488);
          std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
                    ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&dir_cur_bld);
          std::ifstream::~ifstream(&cm);
          uVar7 = 1;
        }
        Json::Value::~Value(&tdio);
        goto LAB_0026ab1b;
      }
      cm.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&cm.Generators.
                     super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&cm,"-E cmake_ninja_dyndep requires value for --dd=","");
      cmSystemTools::Error((string *)&cm);
    }
LAB_0026ac3d:
    if (cm.Generators.
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&cm.Generators.
                  super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0026ab06;
  }
  uVar7 = 1;
LAB_0026ab1b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_ddis);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_tdi._M_dataplus._M_p != &arg_tdi.field_2) {
    operator_delete(arg_tdi._M_dataplus._M_p,
                    CONCAT71(arg_tdi.field_2._M_allocated_capacity._1_7_,
                             arg_tdi.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_lang._M_dataplus._M_p != &arg_lang.field_2) {
    operator_delete(arg_lang._M_dataplus._M_p,
                    CONCAT71(arg_lang.field_2._M_allocated_capacity._1_7_,
                             arg_lang.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg_dd._M_dataplus._M_p != &arg_dd.field_2) {
    operator_delete(arg_dd._M_dataplus._M_p,
                    CONCAT71(arg_dd.field_2._M_allocated_capacity._1_7_,
                             arg_dd.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&arg_full);
  return uVar7;
}

Assistant:

int cmcmd_cmake_ninja_dyndep(std::vector<std::string>::const_iterator argBeg,
                             std::vector<std::string>::const_iterator argEnd)
{
  std::vector<std::string> arg_full =
    cmSystemTools::HandleResponseFile(argBeg, argEnd);

  std::string arg_dd;
  std::string arg_lang;
  std::string arg_tdi;
  std::vector<std::string> arg_ddis;
  for (std::string const& arg : arg_full) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else if (cmHasLiteralPrefix(arg, "--dd=")) {
      arg_dd = arg.substr(5);
    } else if (!cmHasLiteralPrefix(arg, "--") &&
               cmHasLiteralSuffix(arg, ".ddi")) {
      arg_ddis.push_back(arg);
    } else {
      cmSystemTools::Error("-E cmake_ninja_dyndep unknown argument: " + arg);
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --tdi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --lang=");
    return 1;
  }
  if (arg_dd.empty()) {
    cmSystemTools::Error("-E cmake_ninja_dyndep requires value for --dd=");
    return 1;
  }

  Json::Value tdio;
  Json::Value const& tdi = tdio;
  {
    cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
    Json::Reader reader;
    if (!reader.parse(tdif, tdio, false)) {
      cmSystemTools::Error("-E cmake_ninja_dyndep failed to parse " + arg_tdi +
                           reader.getFormattedErrorMessages());
      return 1;
    }
  }

  std::string const dir_cur_bld = tdi["dir-cur-bld"].asString();
  std::string const dir_cur_src = tdi["dir-cur-src"].asString();
  std::string const dir_top_bld = tdi["dir-top-bld"].asString();
  std::string const dir_top_src = tdi["dir-top-src"].asString();
  std::string module_dir = tdi["module-dir"].asString();
  if (!module_dir.empty() && !cmHasLiteralSuffix(module_dir, "/")) {
    module_dir += "/";
  }
  std::vector<std::string> linked_target_dirs;
  Json::Value const& tdi_linked_target_dirs = tdi["linked-target-dirs"];
  if (tdi_linked_target_dirs.isArray()) {
    for (auto const& tdi_linked_target_dir : tdi_linked_target_dirs) {
      linked_target_dirs.push_back(tdi_linked_target_dir.asString());
    }
  }

  cmake cm(cmake::RoleInternal, cmState::Unknown);
  cm.SetHomeDirectory(dir_top_src);
  cm.SetHomeOutputDirectory(dir_top_bld);
  std::unique_ptr<cmGlobalNinjaGenerator> ggd(
    static_cast<cmGlobalNinjaGenerator*>(cm.CreateGlobalGenerator("Ninja")));
  if (!ggd ||
      !ggd->WriteDyndepFile(dir_top_src, dir_top_bld, dir_cur_src, dir_cur_bld,
                            arg_dd, arg_ddis, module_dir, linked_target_dirs,
                            arg_lang)) {
    return 1;
  }
  return 0;
}